

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdGetDescriptorRootData
              (void *handle,void *descriptor_handle,int *script_type,char **locking_script,
              char **address,int *hash_type,char **redeem_script,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey,char **schnorr_pubkey,char **tree_string,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_type sVar4;
  undefined8 *in_RCX;
  DescriptorScriptType *in_RDX;
  long in_RSI;
  undefined8 *in_R8;
  AddressType *in_R9;
  undefined8 *in_stack_00000008;
  DescriptorKeyType *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  undefined8 *in_stack_00000030;
  undefined8 *in_stack_00000038;
  byte *in_stack_00000040;
  undefined4 *in_stack_00000048;
  uint32_t *in_stack_00000050;
  CfdException *except;
  exception *std_except;
  SchnorrPubkey spk;
  SchnorrPubkey schnorr_pubkey_obj;
  ExtPrivkey ext_privkey_obj;
  ExtPubkey ext_pubkey_obj;
  Pubkey pubkey_obj;
  string addr;
  bool is_taproot;
  DescriptorScriptData *desc_data;
  CfdCapiOutputDescriptor *buffer;
  char *work_tree_string;
  char *work_schnorr_pubkey;
  char *work_ext_privkey;
  char *work_ext_pubkey;
  char *work_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  int ret;
  size_type in_stack_fffffffffffff958;
  ExtPrivkey *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  undefined8 in_stack_fffffffffffff978;
  CfdError error_code;
  undefined7 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff987;
  byte local_659;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  byte local_5d1;
  string *in_stack_fffffffffffffa68;
  void *in_stack_fffffffffffffa70;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  byte local_501;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  SchnorrPubkey local_480;
  Pubkey local_468;
  SchnorrPubkey local_450;
  Pubkey local_438;
  ExtPubkey local_420;
  Pubkey local_3b0;
  ExtPubkey local_398;
  ExtPrivkey local_328;
  SchnorrPubkey local_2b0;
  ExtPrivkey local_298;
  ExtPubkey local_220;
  Pubkey local_1b0;
  string local_198;
  string local_178;
  byte local_151;
  string local_150;
  string local_130;
  byte local_109;
  reference local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  long local_c0;
  allocator local_b1;
  string local_b0 [48];
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  AddressType *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  DescriptorScriptType *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff978 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  local_78 = (char *)0x0;
  local_80 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Descriptor",&local_b1);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_c0 = local_18;
  if ((*(long *)(local_18 + 0x10) != 0) &&
     (bVar1 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
              empty((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *
                    )CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970)), !bVar1)) {
    local_108 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
                at((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                   in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_109 = local_108->address_type == kTaprootAddress;
    if (local_20 != (DescriptorScriptType *)0x0) {
      *local_20 = local_108->type;
    }
    if ((local_28 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_108->locking_script), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_130,&local_108->locking_script);
      local_48 = cfd::capi::CreateString
                           ((string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0))
      ;
      std::__cxx11::string::~string((string *)&local_130);
    }
    local_151 = 0;
    local_5d1 = 0;
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_150,&local_108->address);
      local_151 = 1;
      local_5d1 = std::__cxx11::string::empty();
      local_5d1 = local_5d1 ^ 0xff;
    }
    if ((local_151 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    if ((local_5d1 & 1) != 0) {
      cfd::core::Address::GetAddress_abi_cxx11_(&local_178,&local_108->address);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_50 = cfd::capi::CreateString
                             ((string *)
                              CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0));
      }
      std::__cxx11::string::~string((string *)&local_178);
    }
    if (local_38 != (AddressType *)0x0) {
      *local_38 = local_108->address_type;
    }
    if ((in_stack_00000008 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_108->redeem_script), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_198,&local_108->redeem_script);
      local_58 = cfd::capi::CreateString
                           ((string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0))
      ;
      std::__cxx11::string::~string((string *)&local_198);
    }
    if (in_stack_00000010 != (DescriptorKeyType *)0x0) {
      *in_stack_00000010 = local_108->key_type;
    }
    cfd::core::Pubkey::Pubkey(&local_1b0);
    cfd::core::ExtPubkey::ExtPubkey(&local_220);
    cfd::core::ExtPrivkey::ExtPrivkey(&local_298);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_2b0);
    switch(local_108->key_type) {
    case kDescriptorKeyPublic:
    default:
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cfd::core::Pubkey::Pubkey(&local_468,&local_108->key);
        cfd::core::Pubkey::operator=(&local_1b0,&local_468);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x582081);
      }
      break;
    case kDescriptorKeyBip32:
      cfd::core::ExtPubkey::ExtPubkey(&local_420,&local_108->key);
      cfd::core::ExtPubkey::operator=(&local_220,&local_420);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff960);
      cfd::core::ExtPubkey::GetPubkey(&local_438,&local_220);
      cfd::core::Pubkey::operator=(&local_1b0,&local_438);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x581fc8);
      break;
    case kDescriptorKeyBip32Priv:
      cfd::core::ExtPrivkey::ExtPrivkey(&local_328,&local_108->key);
      cfd::core::ExtPrivkey::operator=(&local_298,&local_328);
      cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff960);
      cfd::core::ExtPrivkey::GetExtPubkey(&local_398,&local_298);
      cfd::core::ExtPubkey::operator=(&local_220,&local_398);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff960);
      cfd::core::ExtPubkey::GetPubkey(&local_3b0,&local_220);
      cfd::core::Pubkey::operator=(&local_1b0,&local_3b0);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x581f21);
      break;
    case kDescriptorKeySchnorr:
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cfd::core::SchnorrPubkey::SchnorrPubkey(&local_450,&local_108->key);
        cfd::core::SchnorrPubkey::operator=(&local_2b0,&local_450);
        cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x582025);
      }
    }
    if (((local_109 & 1) != 0) && (in_stack_00000030 != (undefined8 *)0x0)) {
      bVar1 = cfd::core::Pubkey::IsValid(&local_1b0);
      if (bVar1) {
        cfd::core::SchnorrPubkey::FromPubkey(&local_480,&local_1b0,(bool *)0x0);
        cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_4a0,&local_480);
        local_78 = cfd::capi::CreateString
                             ((string *)
                              CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0));
        std::__cxx11::string::~string((string *)&local_4a0);
        cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x58212d);
      }
      else {
        in_stack_fffffffffffff9c7 = cfd::core::SchnorrPubkey::IsValid(&local_2b0);
        if ((bool)in_stack_fffffffffffff9c7) {
          cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_4c0,&local_2b0);
          local_78 = cfd::capi::CreateString
                               ((string *)
                                CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0));
          std::__cxx11::string::~string((string *)&local_4c0);
        }
      }
    }
    if (((local_109 & 1) == 0) ||
       (bVar1 = cfd::core::TaprootScriptTree::IsValid(&local_108->tree), !bVar1)) {
      local_501 = 0;
      local_659 = 0;
      if ((local_109 & 1) != 0) {
        cfd::core::TapBranch::ToString_abi_cxx11_(&local_500,&local_108->branch);
        local_501 = 1;
        local_659 = std::__cxx11::string::empty();
        local_659 = local_659 ^ 0xff;
      }
      if ((local_501 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_500);
      }
      if ((local_659 & 1) != 0) {
        cfd::core::TapBranch::ToString_abi_cxx11_(&local_528,&local_108->branch);
        local_80 = cfd::capi::CreateString
                             ((string *)
                              CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0));
        std::__cxx11::string::~string((string *)&local_528);
      }
    }
    else {
      cfd::core::TapBranch::ToString_abi_cxx11_(&local_4e0,&(local_108->tree).super_TapBranch);
      local_80 = cfd::capi::CreateString
                           ((string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0))
      ;
      std::__cxx11::string::~string((string *)&local_4e0);
    }
    if ((in_stack_00000018 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Pubkey::IsValid(&local_1b0), bVar1)) {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_548,&local_1b0);
      local_60 = cfd::capi::CreateString
                           ((string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0))
      ;
      std::__cxx11::string::~string((string *)&local_548);
    }
    if ((in_stack_00000020 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::ExtPubkey::IsValid(&local_220), bVar1)) {
      cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_568,&local_220);
      local_68 = cfd::capi::CreateString
                           ((string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0))
      ;
      std::__cxx11::string::~string((string *)&local_568);
    }
    if ((in_stack_00000028 != (undefined8 *)0x0) &&
       (in_stack_fffffffffffff977 = cfd::core::ExtPrivkey::IsValid(&local_298),
       (bool)in_stack_fffffffffffff977)) {
      cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_588,&local_298);
      local_70 = cfd::capi::CreateString
                           ((string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0))
      ;
      std::__cxx11::string::~string((string *)&local_588);
    }
    if (in_stack_00000040 != (byte *)0x0) {
      bVar1 = std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::empty
                        ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
                         CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
      *in_stack_00000040 = (bVar1 ^ 0xffU) & 1;
      bVar1 = std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::empty
                        ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
                         CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
      if (!bVar1) {
        *in_stack_00000040 = 1;
        if (in_stack_00000048 != (undefined4 *)0x0) {
          sVar4 = std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::size
                            (*(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
                               **)(local_c0 + 0x20));
          *in_stack_00000048 = (int)sVar4;
        }
        if (in_stack_00000050 != (uint32_t *)0x0) {
          *in_stack_00000050 = local_108->multisig_req_sig_num;
        }
      }
    }
    if (local_48 != (char *)0x0) {
      *local_28 = local_48;
    }
    if (local_50 != (char *)0x0) {
      *local_30 = local_50;
    }
    if (local_58 != (char *)0x0) {
      *in_stack_00000008 = local_58;
    }
    if (local_60 != (char *)0x0) {
      *in_stack_00000018 = local_60;
    }
    if (local_68 != (char *)0x0) {
      *in_stack_00000020 = local_68;
    }
    if (local_70 != (char *)0x0) {
      *in_stack_00000028 = local_70;
    }
    if (local_78 != (char *)0x0) {
      *in_stack_00000030 = local_78;
    }
    if (local_80 != (char *)0x0) {
      *in_stack_00000038 = local_80;
    }
    local_4 = 0;
    cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x58271a);
    cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff960);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff960);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x582741);
    return local_4;
  }
  local_d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_d8.filename = local_d8.filename + 1;
  local_d8.line = 0x1fd;
  local_d8.funcname = "CfdGetDescriptorRootData";
  cfd::core::logger::warn<>(&local_d8,"invalid script_root.");
  local_fa = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Failed to parameter. invalid script_root.",&local_f9);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
             error_code,(string *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
  local_fa = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetDescriptorRootData(
    void* handle, void* descriptor_handle, int* script_type,
    char** locking_script, char** address, int* hash_type,
    char** redeem_script, int* key_type, char** pubkey, char** ext_pubkey,
    char** ext_privkey, char** schnorr_pubkey, char** tree_string,
    bool* is_multisig, uint32_t* max_key_num, uint32_t* req_sig_num) {
  int ret = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  char* work_schnorr_pubkey = nullptr;
  char* work_tree_string = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_root == nullptr) || buffer->script_root->empty()) {
      warn(CFD_LOG_SOURCE, "invalid script_root.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. invalid script_root.");
    }

    const DescriptorScriptData& desc_data = buffer->script_root->at(0);
    bool is_taproot = (desc_data.address_type == AddressType::kTaprootAddress);
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        if (!desc_data.key.empty()) {
          schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        }
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if (is_taproot && (schnorr_pubkey != nullptr)) {
      if (pubkey_obj.IsValid()) {
        auto spk = SchnorrPubkey::FromPubkey(pubkey_obj);
        work_schnorr_pubkey = CreateString(spk.GetHex());
      } else if (schnorr_pubkey_obj.IsValid()) {
        work_schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
      }
    }
    if (is_taproot && desc_data.tree.IsValid()) {
      work_tree_string = CreateString(desc_data.tree.ToString());
    } else if (is_taproot && !desc_data.branch.ToString().empty()) {
      work_tree_string = CreateString(desc_data.branch.ToString());
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      *is_multisig = !buffer->multisig_key_list->empty();
      if (!buffer->multisig_key_list->empty()) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    if (work_schnorr_pubkey != nullptr) *schnorr_pubkey = work_schnorr_pubkey;
    if (work_tree_string != nullptr) *tree_string = work_tree_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    ret = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
      &work_ext_pubkey, &work_ext_privkey);
  FreeBufferOnError(&work_schnorr_pubkey, &work_tree_string);
  return ret;
}